

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O3

buffer_s resize_ws_buffer(ws_s *owner,buffer_s buff)

{
  size_t __size;
  buffer_s bVar1;
  buffer_s buff_00;
  
  buff_00.data = buff.data;
  __size = (buff.size & 0xfffffffffffff000) + 0x1000;
  bVar1.data = realloc(buff_00.data,__size);
  if (bVar1.data == (void *)0x0) {
    buff_00.size = __size;
    free_ws_buffer(owner,buff_00);
    __size = 0;
  }
  bVar1.size = __size;
  return bVar1;
}

Assistant:

struct buffer_s resize_ws_buffer(ws_s *owner, struct buffer_s buff) {
  buff.size = round_up_buffer_size(buff.size);
  void *tmp = realloc(buff.data, buff.size);
  if (!tmp) {
    free_ws_buffer(owner, buff);
    buff.data = NULL;
    buff.size = 0;
  }
  buff.data = tmp;
  return buff;
}